

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O1

void ReplaceReservedXmlCharacters(char *input,char *output)

{
  char *pcVar1;
  size_t sVar2;
  char tempString [8192];
  char local_2028 [8200];
  
  if (output != (char *)0x0 && input != (char *)0x0) {
    strcpy(output,input);
    for (pcVar1 = strchr(output,0x26); pcVar1 != (char *)0x0; pcVar1 = strchr(pcVar1,0x26)) {
      local_2028[0] = '\0';
      sVar2 = strlen(pcVar1);
      if (1 < sVar2) {
        strcpy(local_2028,pcVar1 + 1);
      }
      sprintf(pcVar1,"&amp;%s",local_2028);
    }
    for (pcVar1 = strchr(output,0x3c); pcVar1 != (char *)0x0; pcVar1 = strchr(pcVar1,0x3c)) {
      local_2028[0] = '\0';
      sVar2 = strlen(pcVar1);
      if (1 < sVar2) {
        strcpy(local_2028,pcVar1 + 1);
      }
      sprintf(pcVar1,"&lt;%s",local_2028);
    }
    for (pcVar1 = strchr(output,0x3e); pcVar1 != (char *)0x0; pcVar1 = strchr(pcVar1,0x3e)) {
      local_2028[0] = '\0';
      sVar2 = strlen(pcVar1);
      if (1 < sVar2) {
        strcpy(local_2028,pcVar1 + 1);
      }
      sprintf(pcVar1,"&gt;%s",local_2028);
    }
    for (pcVar1 = strchr(output,0x27); pcVar1 != (char *)0x0; pcVar1 = strchr(pcVar1,0x27)) {
      local_2028[0] = '\0';
      sVar2 = strlen(pcVar1);
      if (1 < sVar2) {
        strcpy(local_2028,pcVar1 + 1);
      }
      sprintf(pcVar1,"&apos;%s",local_2028);
    }
    for (pcVar1 = strchr(output,0x22); pcVar1 != (char *)0x0; pcVar1 = strchr(pcVar1,0x22)) {
      local_2028[0] = '\0';
      sVar2 = strlen(pcVar1);
      if (1 < sVar2) {
        strcpy(local_2028,pcVar1 + 1);
      }
      sprintf(pcVar1,"&quot;%s",local_2028);
    }
  }
  return;
}

Assistant:

static void ReplaceReservedXmlCharacters(const char *input, char *output )
{
	char *currentPosition;
	char tempString[8*1024];

	if((input == NULL) || (output == NULL))
	{
		return;
	}

	strcpy(output, input);

	/*Replace '&' with "&amp;"
	 *Note1: '&' has to be processed first as otherwise we replace the
	 *       '&' in the escaped characters.
	 *Note2: We assume that the input string does not have any escaped
	 *       characters already.
     */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '&')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&amp;%s", tempString);
	}

	/* Replace '<' with "&lt;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '<')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&lt;%s", tempString);
	}

	/* Replace '>' with "&gt;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '>')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&gt;%s", tempString);
	}

    /* Replace ''' with "&apos;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '\'')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&apos;%s", tempString);
	}

	/* Replace '"' with "&quot;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '"')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&quot;%s", tempString);
	}
}